

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int handle_add_isystem(dmr_C *C,stream *stream,token **line,token *token)

{
  token *token_00;
  
  token_00 = token->next;
  if (token_00 != &dmrC_eof_token_entry_) {
    do {
      if ((SUB84(token_00->pos,0) & 0x3f) != 0xf) {
        dmrC_sparse_error(C,token_00->pos,"expected path string");
        return 1;
      }
      add_path_entry(C,token_00,(char *)((long)&((token_00->field_2).ident)->next + 4),
                     &C->sys_includepath);
      token_00 = token_00->next;
    } while (token_00 != &dmrC_eof_token_entry_);
  }
  return 1;
}

Assistant:

static int handle_add_isystem(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
        (void)line;
        (void)stream;
	for (;;) {
		token = token->next;
		if (dmrC_eof_token(token))
			return 1;
		if (dmrC_token_type(token) != TOKEN_STRING) {
			dmrC_sparse_error(C, token->pos, "expected path string");
			return 1;
		}
		add_path_entry(C, token, token->string->data, &C->sys_includepath);
	}
}